

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O0

double __thiscall Imath_3_2::Vec4<double>::lengthTiny(Vec4<double> *this)

{
  double *in_RDI;
  double max;
  double absW;
  double absZ;
  double absY;
  double absX;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_38;
  double local_8;
  
  if (*in_RDI < 0.0) {
    local_48 = -*in_RDI;
  }
  else {
    local_48 = *in_RDI;
  }
  if (in_RDI[1] < 0.0) {
    local_50 = -in_RDI[1];
  }
  else {
    local_50 = in_RDI[1];
  }
  if (in_RDI[2] < 0.0) {
    local_58 = -in_RDI[2];
  }
  else {
    local_58 = in_RDI[2];
  }
  if (in_RDI[3] < 0.0) {
    local_60 = -in_RDI[3];
  }
  else {
    local_60 = in_RDI[3];
  }
  local_38 = local_48;
  if (local_48 < local_50) {
    local_38 = local_50;
  }
  if (local_38 < local_58) {
    local_38 = local_58;
  }
  if (local_38 < local_60) {
    local_38 = local_60;
  }
  if ((local_38 != 0.0) || (NAN(local_38))) {
    local_8 = sqrt((local_60 / local_38) * (local_60 / local_38) +
                   (local_58 / local_38) * (local_58 / local_38) +
                   (local_48 / local_38) * (local_48 / local_38) +
                   (local_50 / local_38) * (local_50 / local_38));
    local_8 = local_38 * local_8;
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline T
Vec4<T>::lengthTiny () const IMATH_NOEXCEPT
{
    T absX = (x >= T (0)) ? x : -x;
    T absY = (y >= T (0)) ? y : -y;
    T absZ = (z >= T (0)) ? z : -z;
    T absW = (w >= T (0)) ? w : -w;

    T max = absX;

    if (max < absY) max = absY;

    if (max < absZ) max = absZ;

    if (max < absW) max = absW;

    if (IMATH_UNLIKELY (max == T (0))) return T (0);

    //
    // Do not replace the divisions by max with multiplications by 1/max.
    // Computing 1/max can overflow but the divisions below will always
    // produce results less than or equal to 1.
    //

    absX /= max;
    absY /= max;
    absZ /= max;
    absW /= max;

    return max *
           std::sqrt (absX * absX + absY * absY + absZ * absZ + absW * absW);
}